

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O3

string * GetTestPath_abi_cxx11_(void)

{
  bool bVar1;
  string *in_RDI;
  char local_1018 [8];
  char path [4096];
  
  bVar1 = GetUniquePathFromEnv("GPROF_TEST_PATH",local_1018);
  if (bVar1) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    strlen(local_1018);
    std::__cxx11::string::_M_construct<char_const*>();
    return in_RDI;
  }
  syscall(1,2,"Check failed: GetUniquePathFromEnv(TEST_VAR, path)\n",0x33);
  abort();
}

Assistant:

std::string GetTestPath() {
  char path[PATH_MAX];
  CHECK(GetUniquePathFromEnv(TEST_VAR, path));
  return path;
}